

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O2

bool __thiscall
mocker::detail::ReassociationImpl::areSameAddrs
          (ReassociationImpl *this,shared_ptr<mocker::ir::Addr> *lhs,
          shared_ptr<mocker::ir::Addr> *rhs)

{
  __type _Var1;
  shared_ptr<mocker::ir::IntLiteral> lhsLit;
  shared_ptr<mocker::ir::Reg> lhsReg;
  shared_ptr<mocker::ir::IntLiteral> rhsLit;
  shared_ptr<mocker::ir::Reg> rhsReg;
  shared_ptr<mocker::ir::Addr> local_60;
  shared_ptr<mocker::ir::Addr> local_50;
  shared_ptr<mocker::ir::Addr> local_40;
  shared_ptr<mocker::ir::Addr> local_30;
  
  std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>(&local_50);
  std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(&local_60);
  if (local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0 &&
      local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("lhsReg || lhsLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                  ,0x9a,
                  "bool mocker::detail::ReassociationImpl::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
                 );
  }
  std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>(&local_30);
  std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(&local_40);
  if (local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0 ||
      local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 ||
        local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 ||
          local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        _Var1 = false;
      }
      else {
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_50.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_30.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1));
      }
    }
    else {
      _Var1 = local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Addr ==
              local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Addr;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return _Var1;
  }
  __assert_fail("rhsReg || rhsLit",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                ,0x9d,
                "bool mocker::detail::ReassociationImpl::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
               );
}

Assistant:

bool detail::ReassociationImpl::areSameAddrs(
    const std::shared_ptr<ir::Addr> &lhs,
    const std::shared_ptr<ir::Addr> &rhs) {
  auto lhsReg = ir::dyc<ir::Reg>(lhs);
  auto lhsLit = ir::dyc<ir::IntLiteral>(lhs);
  assert(lhsReg || lhsLit);
  auto rhsReg = ir::dyc<ir::Reg>(rhs);
  auto rhsLit = ir::dyc<ir::IntLiteral>(rhs);
  assert(rhsReg || rhsLit);
  if (lhsLit && rhsLit)
    return lhsLit->getVal() == rhsLit->getVal();
  if (lhsReg && rhsReg)
    return lhsReg->getIdentifier() == rhsReg->getIdentifier();
  return false;
}